

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

String __thiscall testing::internal::StreamableToString<char*>(internal *this,char **streamable)

{
  ostream *in_RAX;
  size_t sVar1;
  size_t extraout_RDX;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar3;
  char *__s;
  String SVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  size_t sVar2;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX;
  Message::Message((Message *)&local_28);
  __s = *streamable;
  if (__s == (char *)0x0) {
    sVar3.ptr_ = local_28.ptr_ + 0x10;
    sVar1 = 6;
    __s = "(null)";
  }
  else {
    sVar3.ptr_ = local_28.ptr_;
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar3.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_28.ptr_ + 0x10);
    }
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar3.ptr_,__s,sVar1);
  SVar4 = StringStreamToString(this,local_28.ptr_);
  sVar2 = SVar4.length_;
  if (local_28.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_28.ptr_ + 8))();
    sVar2 = extraout_RDX;
  }
  SVar4.length_ = sVar2;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}